

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_armor.cpp
# Opt level: O3

void __thiscall
AHexenArmor::AbsorbDamage(AHexenArmor *this,int damage,FName *damageType,int *newdamage)

{
  AInventory *pAVar1;
  bool bVar2;
  int i;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  FName local_28;
  FName local_24;
  
  local_24 = (FName)damageType->Index;
  bVar2 = DamageTypeDefinition::IgnoreArmor(&local_24);
  if (!bVar2) {
    dVar4 = this->Slots[0] + this->Slots[1] + this->Slots[2] + this->Slots[3] + this->Slots[4];
    if ((dVar4 != 0.0) || (NAN(dVar4))) {
      lVar3 = 0;
      do {
        dVar6 = this->Slots[lVar3];
        if (((dVar6 != 0.0) || (NAN(dVar6))) &&
           ((9999 < damage ||
            (dVar6 = dVar6 + (this->SlotsIncrement[lVar3] * (double)damage) / -300.0,
            this->Slots[lVar3] = dVar6, dVar6 < 2.0)))) {
          this->Slots[lVar3] = 0.0;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      dVar6 = 100.0;
      if (dVar4 <= 100.0) {
        dVar6 = dVar4;
      }
      dVar5 = ((double)damage * dVar6) / 100.0;
      dVar4 = dVar6 + dVar6;
      if ((double)(int)dVar5 <= dVar6 + dVar6) {
        dVar4 = dVar5;
      }
      damage = *newdamage - (int)dVar4;
      *newdamage = damage;
    }
  }
  pAVar1 = (this->super_AArmor).super_AInventory.super_AActor.Inventory.field_0.p;
  if (pAVar1 != (AInventory *)0x0) {
    if ((*(byte *)((long)&(pAVar1->super_AActor).super_DThinker + 0x20) & 0x20) == 0) {
      _local_28 = CONCAT44(local_24.Index,damageType->Index);
      (**(code **)(*(long *)&(pAVar1->super_AActor).super_DThinker + 0x158))
                (pAVar1,damage,&local_28,newdamage);
    }
    else {
      (this->super_AArmor).super_AInventory.super_AActor.Inventory.field_0.p = (AInventory *)0x0;
    }
  }
  return;
}

Assistant:

void AHexenArmor::AbsorbDamage (int damage, FName damageType, int &newdamage)
{
	if (!DamageTypeDefinition::IgnoreArmor(damageType))
	{
		double savedPercent = Slots[0] + Slots[1] + Slots[2] + Slots[3] + Slots[4];

		if (savedPercent)
		{ // armor absorbed some damage
			if (savedPercent > 100)
			{
				savedPercent = 100;
			}
			for (int i = 0; i < 4; i++)
			{
				if (Slots[i])
				{
					// 300 damage always wipes out the armor unless some was added
					// with the dragon skin bracers.
					if (damage < 10000)
					{
						Slots[i] -= damage * SlotsIncrement[i] / 300.;
						if (Slots[i] < 2)
						{
							Slots[i] = 0;
						}
					}
					else
					{
						Slots[i] = 0;
					}
				}
			}
			int saved = int(damage * savedPercent / 100.);
			if (saved > savedPercent*2)
			{	
				saved = int(savedPercent*2);
			}
			newdamage -= saved;
			damage = newdamage;
		}
	}
	if (Inventory != NULL)
	{
		Inventory->AbsorbDamage (damage, damageType, newdamage);
	}
}